

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double signx(double x)

{
  return *(double *)(&DAT_0014eef0 + (ulong)(x < 0.0) * 8);
}

Assistant:

double signx(double x) {
	double sgn;
	if (x >= 0.) {
		sgn = 1.0;
	}
	else {
		sgn = -1.0;
	}
	return sgn;
}